

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.h
# Opt level: O0

btMatrix3x3 * __thiscall btSoftBody::Body::invWorldInertia(Body *this)

{
  int iVar1;
  long *in_RDI;
  btScalar *unaff_retaddr;
  btScalar *in_stack_00000008;
  btScalar *in_stack_00000010;
  btScalar *in_stack_00000018;
  btScalar *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  btMatrix3x3 *local_8;
  
  if (invWorldInertia()::iwi == '\0') {
    iVar1 = __cxa_guard_acquire(&invWorldInertia()::iwi);
    if (iVar1 != 0) {
      btMatrix3x3::btMatrix3x3
                ((btMatrix3x3 *)0x0,(btScalar *)0x0,(btScalar *)0x0,(btScalar *)0x0,
                 (btScalar *)(ulong)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                 unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018);
      __cxa_guard_release(&invWorldInertia()::iwi);
    }
  }
  if (in_RDI[1] == 0) {
    if (*in_RDI == 0) {
      local_8 = &invWorldInertia::iwi;
    }
    else {
      local_8 = (btMatrix3x3 *)(*in_RDI + 0xd8);
    }
  }
  else {
    local_8 = btRigidBody::getInvInertiaTensorWorld((btRigidBody *)in_RDI[1]);
  }
  return local_8;
}

Assistant:

const btMatrix3x3&			invWorldInertia() const
		{
			static const btMatrix3x3	iwi(0,0,0,0,0,0,0,0,0);
			if(m_rigid) return(m_rigid->getInvInertiaTensorWorld());
			if(m_soft)	return(m_soft->m_invwi);
			return(iwi);
		}